

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetWindowHitTestHole(ImGuiWindow *window,ImVec2 *pos,ImVec2 *size)

{
  window->HitTestHoleSize = (ImVec2ih)((int)size->x & 0xffffU | (int)size->y << 0x10);
  window->HitTestHoleOffset =
       (ImVec2ih)
       ((int)(pos->x - (window->Pos).x) & 0xffffU | (int)(pos->y - (window->Pos).y) << 0x10);
  return;
}

Assistant:

explicit ImVec2ih(const ImVec2& rhs) { x = (short)rhs.x; y = (short)rhs.y; }